

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

uint anon_unknown.dwarf_c3752::AllocateGlobalVariable
               (ExpressionContext *ctx,SynBase *source,uint alignment,longlong size)

{
  ScopeData *pSVar1;
  TypeBase *pTVar2;
  _func_int **pp_Var3;
  int iVar4;
  ulong uVar5;
  ExprBase *pEVar6;
  ExprBase *pEVar7;
  undefined4 extraout_var;
  TypeRef *pTVar8;
  undefined4 extraout_var_00;
  ExprBase *arg3;
  uint uVar9;
  VariableData *target;
  InplaceStr name;
  ExprBase *arg1;
  undefined4 extraout_var_01;
  
  if ((alignment < 0x11) &&
     (uVar9 = alignment - (alignment >> 1 & 0x55555555),
     uVar9 = (uVar9 >> 2 & 0x33333333) + (uVar9 & 0x33333333),
     ((uVar9 >> 4) + uVar9 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2)) {
    pSVar1 = ctx->globalScope;
    uVar9 = GetAlignmentOffset(pSVar1->dataSize,alignment);
    uVar5 = (ulong)uVar9 + pSVar1->dataSize;
    pSVar1->dataSize = uVar5;
    if ((long)((uVar5 & 0xffffffff) + size) < 0x1000001) {
      pSVar1->dataSize = size + uVar5;
      return (uint)uVar5;
    }
    ExpressionContext::Stop(ctx,source,"ERROR: variable size limit exceeded");
    pEVar6 = GetFunctionUpvalue(ctx,source,target);
    pEVar6 = CreateGetAddress(ctx,source,pEVar6);
    pEVar7 = CreateVariableAccess(ctx,source,target,false);
    pEVar7 = CreateGetAddress(ctx,source,pEVar7);
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    arg1 = (ExprBase *)CONCAT44(extraout_var,iVar4);
    pTVar8 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
    arg1->typeID = 0x12;
    arg1->source = source;
    arg1->type = &pTVar8->super_TypeBase;
    arg1->next = (ExprBase *)0x0;
    arg1->listed = false;
    arg1->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002409d8;
    arg1[1]._vptr_ExprBase = (_func_int **)pEVar7;
    arg1[1].typeID = 0xd;
    uVar9 = GetAlignmentOffset(0x10,target->type->alignment);
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var_00,iVar4);
    pTVar2 = ctx->typeInt;
    pEVar7->typeID = 6;
    pEVar7->source = source;
    pEVar7->type = pTVar2;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240500;
    pEVar7[1]._vptr_ExprBase = (_func_int **)(ulong)(uVar9 + 0x10);
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    arg3 = (ExprBase *)CONCAT44(extraout_var_01,iVar4);
    pTVar2 = ctx->typeInt;
    pp_Var3 = (_func_int **)target->type->size;
    arg3->typeID = 6;
    arg3->source = source;
    arg3->type = pTVar2;
    arg3->next = (ExprBase *)0x0;
    arg3->listed = false;
    arg3->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240500;
    arg3[1]._vptr_ExprBase = pp_Var3;
    name.end = "";
    name.begin = "__closeUpvalue";
    pEVar6 = CreateFunctionCall4(ctx,source,name,pEVar6,arg1,pEVar7,arg3,false,true,true);
    return (uint)pEVar6;
  }
  __assert_fail("(alignment & (alignment - 1)) == 0 && alignment <= 16",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x19a,
                "unsigned int (anonymous namespace)::AllocateGlobalVariable(ExpressionContext &, SynBase *, unsigned int, long long)"
               );
}

Assistant:

unsigned AllocateGlobalVariable(ExpressionContext &ctx, SynBase *source, unsigned alignment, long long size)
	{
		assert((alignment & (alignment - 1)) == 0 && alignment <= 16);

		ScopeData *scope = ctx.globalScope;

		scope->dataSize += GetAlignmentOffset(scope->dataSize, alignment);

		unsigned result = unsigned(scope->dataSize);

		if(result + size > (1 << 24))
			ctx.Stop(source, "ERROR: variable size limit exceeded");

		scope->dataSize += size;

		return result;
	}